

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramsurface.hpp
# Opt level: O0

void __thiscall ParamSurface::buildmesh(ParamSurface *this)

{
  vec3f v3;
  vec3f v2;
  vec3f v2_00;
  vec3f v1;
  vec3f v1_00;
  vec2f vt3;
  vec2f vt3_00;
  vec3f vn1;
  vec3f vn1_00;
  vec3f vn2;
  vec3f vn2_00;
  vec3f vn3;
  vec3f vn3_00;
  reference ppBVar1;
  void *pvVar2;
  long *in_RDI;
  float fVar3;
  float fVar4;
  float extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  float extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  vec3f vVar5;
  vec2f u11;
  vec2f u10;
  vec2f u01;
  vec2f u00;
  vec3f p11;
  vec3f p10;
  vec3f p01;
  vec3f p00;
  vec3f t;
  vec3f t2;
  vec3f t1;
  float j;
  float i;
  vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_> trigs;
  float step;
  vec2f vVar6;
  vec2f vVar7;
  vec3f *in_stack_fffffffffffff9e0;
  float in_stack_fffffffffffff9e8;
  undefined4 in_stack_fffffffffffff9ec;
  vec3f *in_stack_fffffffffffff9f0;
  Triangle *local_5e0;
  undefined1 in_stack_fffffffffffffa78 [16];
  Triangle *local_510;
  undefined4 in_stack_fffffffffffffc20;
  float fVar8;
  vec2f vt2;
  float fVar9;
  float in_stack_fffffffffffffc48;
  undefined4 in_stack_fffffffffffffc4c;
  float in_stack_fffffffffffffc50;
  float in_stack_fffffffffffffc68;
  undefined4 in_stack_fffffffffffffc6c;
  float in_stack_fffffffffffffc70;
  float in_stack_fffffffffffffc88;
  undefined8 in_stack_fffffffffffffc8c;
  float in_stack_fffffffffffffca0;
  float in_stack_fffffffffffffca4;
  undefined8 in_stack_fffffffffffffca8;
  float in_stack_fffffffffffffcb0;
  undefined8 in_stack_fffffffffffffcb8;
  float in_stack_fffffffffffffcc0;
  vec3f *in_stack_fffffffffffffcc8;
  float in_stack_fffffffffffffcd0;
  vec2f local_100;
  vec2f local_f8;
  vec2f local_f0;
  vec2f local_e8;
  undefined8 local_e0;
  float local_d8;
  undefined8 local_d0;
  float local_c8;
  undefined8 local_c0;
  float local_b8;
  undefined8 local_b0;
  float local_a8;
  undefined8 local_a0;
  float local_98;
  undefined8 local_90;
  float local_88;
  vec2f local_80;
  float local_78;
  vec2f local_70;
  float local_68;
  vec3f *local_64;
  float local_5c;
  vec3f local_58 [2];
  vec3f local_3c;
  float local_30;
  float local_2c;
  float local_c;
  
  local_c = 0.01;
  std::vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>::vector
            ((vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_> *)0x17c32d);
  for (local_2c = 0.0; local_2c + local_c / 2.0 < 1.0; local_2c = local_c + local_2c) {
    for (local_30 = 0.0; local_30 + local_c / 2.0 < 1.0; local_30 = local_c + local_30) {
      vec3f::vec3f(&local_3c);
      vec3f::vec3f(local_58);
      vec3f::vec3f((vec3f *)&local_64);
      fVar8 = local_30;
      local_80 = (vec2f)(**(code **)(*in_RDI + 0x18))(local_2c,in_RDI,&local_3c,local_58);
      fVar4 = extraout_XMM0_Dc;
      fVar9 = extraout_XMM0_Dd;
      local_78 = fVar8;
      local_70 = local_80;
      local_68 = fVar8;
      fVar3 = local_30 + local_c;
      vt2 = local_80;
      local_a0 = (**(code **)(*in_RDI + 0x18))(local_2c,in_RDI,&local_3c,local_58);
      local_98 = fVar3;
      local_90 = local_a0;
      local_88 = local_98;
      fVar3 = local_30;
      local_c0 = (**(code **)(*in_RDI + 0x18))(local_2c + local_c,in_RDI,&local_3c,local_58);
      local_b8 = fVar3;
      local_b0 = local_c0;
      local_a8 = local_b8;
      fVar3 = local_30 + local_c;
      local_e0 = (**(code **)(*in_RDI + 0x18))(local_2c + local_c,in_RDI,&local_3c,local_58);
      local_d8 = fVar3;
      local_d0 = local_e0;
      local_c8 = local_d8;
      vec2f::vec2f(&local_e8,local_2c,local_30);
      vec2f::vec2f(&local_f0,local_2c,local_30 + local_c);
      vec2f::vec2f(&local_f8,local_2c + local_c,local_30);
      vec2f::vec2f(&local_100,local_2c + local_c,local_30 + local_c);
      ::operator-(in_stack_fffffffffffff9f0,
                  (vec3f *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
      ::operator-(in_stack_fffffffffffff9f0,
                  (vec3f *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
      cross(in_stack_fffffffffffff9f0,
            (vec3f *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
      fVar3 = norm((vec3f *)0x17c816);
      if (1e-12 < fVar3) {
        operator_new(0xa0);
        v1.y = (float)(int)in_stack_fffffffffffffc8c;
        v1.z = (float)(int)((ulong)in_stack_fffffffffffffc8c >> 0x20);
        v1.x = in_stack_fffffffffffffc88;
        v2.y = (float)in_stack_fffffffffffffc6c;
        v2.x = in_stack_fffffffffffffc68;
        v2.z = in_stack_fffffffffffffc70;
        vVar5.y = (float)in_stack_fffffffffffffc4c;
        vVar5.x = in_stack_fffffffffffffc48;
        vVar5.z = in_stack_fffffffffffffc50;
        vVar7.y = fVar9;
        vVar7.x = fVar4;
        vt3.y = in_stack_fffffffffffffca4;
        vt3.x = in_stack_fffffffffffffca0;
        vn1.z = in_stack_fffffffffffffcb0;
        vn1.x = (float)(int)in_stack_fffffffffffffca8;
        vn1.y = (float)(int)((ulong)in_stack_fffffffffffffca8 >> 0x20);
        vn2.z = in_stack_fffffffffffffcc0;
        vn2.x = (float)(int)in_stack_fffffffffffffcb8;
        vn2.y = (float)(int)((ulong)in_stack_fffffffffffffcb8 >> 0x20);
        vn3.z = in_stack_fffffffffffffcd0;
        vn3._0_8_ = in_stack_fffffffffffffcc8;
        vVar6 = local_f0;
        in_stack_fffffffffffff9e0 = local_64;
        in_stack_fffffffffffff9e8 = local_5c;
        in_stack_fffffffffffff9f0 = local_64;
        Triangle::Triangle((Triangle *)CONCAT44(fVar8,in_stack_fffffffffffffc20),v1,v2,vVar5,vVar7,
                           vt2,vt3,vn1,vn2,vn3);
        std::vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>::push_back
                  ((vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_> *)
                   in_stack_fffffffffffff9e0,(value_type *)vVar6);
      }
      ::operator-(in_stack_fffffffffffff9f0,
                  (vec3f *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
      ::operator-(in_stack_fffffffffffff9f0,
                  (vec3f *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
      cross(in_stack_fffffffffffff9f0,
            (vec3f *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
      fVar3 = norm((vec3f *)0x17cbda);
      if (1e-12 < fVar3) {
        ppBVar1 = std::vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>::back
                            ((vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_> *)
                             in_stack_fffffffffffff9e0);
        if (*ppBVar1 == (value_type)0x0) {
          local_510 = (Triangle *)0x0;
        }
        else {
          local_510 = (Triangle *)
                      __dynamic_cast(*ppBVar1,&BasicPrimitive::typeinfo,&Triangle::typeinfo,0);
        }
        Triangle::recompute_normal(local_510);
      }
      ::operator-(in_stack_fffffffffffff9f0,
                  (vec3f *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
      ::operator-(in_stack_fffffffffffff9f0,
                  (vec3f *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
      cross(in_stack_fffffffffffff9f0,
            (vec3f *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
      fVar3 = norm((vec3f *)0x17cd98);
      if (1e-12 < fVar3) {
        operator_new(0xa0);
        v1_00.y = (float)(int)in_stack_fffffffffffffc8c;
        v1_00.z = (float)(int)((ulong)in_stack_fffffffffffffc8c >> 0x20);
        v1_00.x = in_stack_fffffffffffffc88;
        v2_00.y = (float)in_stack_fffffffffffffc6c;
        v2_00.x = in_stack_fffffffffffffc68;
        v2_00.z = in_stack_fffffffffffffc70;
        v3.y = (float)in_stack_fffffffffffffc4c;
        v3.x = in_stack_fffffffffffffc48;
        v3.z = in_stack_fffffffffffffc50;
        vVar6.y = fVar9;
        vVar6.x = fVar4;
        vt3_00.y = in_stack_fffffffffffffca4;
        vt3_00.x = local_88;
        vn1_00.z = local_c8;
        vn1_00.x = (float)(undefined4)local_d0;
        vn1_00.y = (float)local_d0._4_4_;
        vn2_00.z = local_a8;
        vn2_00.x = (float)(undefined4)local_b0;
        vn2_00.y = (float)local_b0._4_4_;
        vn3_00.z = local_5c;
        vn3_00._0_8_ = local_64;
        vVar7 = local_f0;
        in_stack_fffffffffffff9e0 = local_64;
        in_stack_fffffffffffff9e8 = local_5c;
        in_stack_fffffffffffff9f0 = local_64;
        in_stack_fffffffffffffca0 = local_88;
        in_stack_fffffffffffffca8 = local_d0;
        in_stack_fffffffffffffcb0 = local_c8;
        in_stack_fffffffffffffcb8 = local_b0;
        in_stack_fffffffffffffcc0 = local_a8;
        in_stack_fffffffffffffcc8 = local_64;
        in_stack_fffffffffffffcd0 = local_5c;
        Triangle::Triangle((Triangle *)CONCAT44(fVar8,in_stack_fffffffffffffc20),v1_00,v2_00,v3,
                           vVar6,vt2,vt3_00,vn1_00,vn2_00,vn3_00);
        std::vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>::push_back
                  ((vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_> *)
                   in_stack_fffffffffffff9e0,(value_type *)vVar7);
      }
      vVar5 = ::operator-(in_stack_fffffffffffff9f0,
                          (vec3f *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
      in_stack_fffffffffffffc88 = vVar5.z;
      in_stack_fffffffffffffa78._8_4_ = extraout_XMM0_Dc_00;
      in_stack_fffffffffffffa78._0_8_ = vVar5._0_8_;
      in_stack_fffffffffffffa78._12_4_ = extraout_XMM0_Dd_00;
      in_stack_fffffffffffffc70 = vVar5.x;
      vVar5 = ::operator-(in_stack_fffffffffffff9f0,
                          (vec3f *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
      in_stack_fffffffffffffc68 = vVar5.z;
      in_stack_fffffffffffffc50 = vVar5.x;
      vVar5 = cross(in_stack_fffffffffffff9f0,
                    (vec3f *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
      in_stack_fffffffffffffc48 = vVar5.z;
      in_stack_fffffffffffffc8c = vVar5._0_8_;
      fVar4 = norm((vec3f *)0x17d131);
      if (1e-12 < fVar4) {
        ppBVar1 = std::vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>::back
                            ((vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_> *)
                             in_stack_fffffffffffff9e0);
        if (*ppBVar1 == (value_type)0x0) {
          local_5e0 = (Triangle *)0x0;
        }
        else {
          local_5e0 = (Triangle *)
                      __dynamic_cast(*ppBVar1,&BasicPrimitive::typeinfo,&Triangle::typeinfo,0);
        }
        Triangle::recompute_normal(local_5e0);
      }
    }
  }
  pvVar2 = operator_new(0x40);
  BasicContainer::BasicContainer(in_stack_fffffffffffffa78._8_8_,in_stack_fffffffffffffa78._0_8_);
  in_RDI[1] = (long)pvVar2;
  std::vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>::~vector
            ((vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_> *)
             in_stack_fffffffffffff9f0);
  return;
}

Assistant:

void buildmesh()
	{
		// build approximating mesh
		float step = 0.01;
		std::vector<BasicPrimitive*> trigs;
		for (float i=0; i+step/2<1; i+=step)
			for (float j=0; j+step/2<1; j+=step)
			{
				vec3f t1,t2,t; // dummy vars
				vec3f p00 = surface(i,j,t1,t2);
				vec3f p01 = surface(i,j+step,t1,t2);
				vec3f p10 = surface(i+step,j,t1,t2);
				vec3f p11 = surface(i+step,j+step,t1,t2);
				vec2f u00 = vec2f(i,j);
				vec2f u01 = vec2f(i,j+step);
				vec2f u10 = vec2f(i+step,j);
				vec2f u11 = vec2f(i+step,j+step);
				if (norm(cross(p00-p01,p00-p10)) > 1e-12)
				trigs.push_back(new Triangle(p00,p10,p01,u00,u10,u01,t,t,t));
				if (norm(cross(p00-p01,p00-p10)) > 1e-12)
				dynamic_cast<Triangle*>(trigs.back())->recompute_normal();
				if (norm(cross(p11-p01,p11-p10)) > 1e-12)
				trigs.push_back(new Triangle(p10,p11,p01,u10,u11,u01,t,t,t));
				if (norm(cross(p11-p01,p11-p10)) > 1e-12)
				dynamic_cast<Triangle*>(trigs.back())->recompute_normal();
			}
		mesh = new BasicContainer(trigs);
	}